

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O0

int __thiscall
robin_hood::detail::
Table<true,_80UL,_unsigned_long,_std::vector<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>,_robin_hood::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>_>
::init(Table<true,_80UL,_unsigned_long,_std::vector<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>,_robin_hood::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>_>
       *this,EVP_PKEY_CTX *ctx)

{
  DataNode<robin_hood::detail::Table<true,_80UL,_unsigned_long,_std::vector<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>,_robin_hood::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>_>,_true>
  *pDVar1;
  Table<true,_80UL,_unsigned_long,_std::vector<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>,_robin_hood::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>_>
  *this_local;
  
  pDVar1 = reinterpret_cast_no_cast_align_warning<robin_hood::detail::Table<true,80ul,unsigned_long,std::vector<Rml::StyleSheetNode_const*,std::allocator<Rml::StyleSheetNode_const*>>,robin_hood::hash<unsigned_long,void>,std::equal_to<unsigned_long>>::DataNode<robin_hood::detail::Table<true,80ul,unsigned_long,std::vector<Rml::StyleSheetNode_const*,std::allocator<Rml::StyleSheetNode_const*>>,robin_hood::hash<unsigned_long,void>,std::equal_to<unsigned_long>>,true>*>
                     (&this->mMask);
  this->mKeyVals = pDVar1;
  this->mInfo = (uint8_t *)&this->mMask;
  this->mNumElements = 0;
  this->mMask = 0;
  this->mMaxNumElementsAllowed = 0;
  this->mInfoInc = 0x20;
  this->mInfoHashShift = 0;
  return (int)this;
}

Assistant:

void init() noexcept {
        mKeyVals = reinterpret_cast_no_cast_align_warning<Node*>(&mMask);
        mInfo = reinterpret_cast<uint8_t*>(&mMask);
        mNumElements = 0;
        mMask = 0;
        mMaxNumElementsAllowed = 0;
        mInfoInc = InitialInfoInc;
        mInfoHashShift = InitialInfoHashShift;
    }